

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

Object * __thiscall symbols::StringObject::nextItem(StringObject *this)

{
  int iVar1;
  StringObject *this_00;
  reference pvVar2;
  string local_40;
  
  iVar1 = this->iter_index;
  if (iVar1 < (int)(this->value)._M_string_length) {
    this_00 = (StringObject *)operator_new(0x38);
    pvVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                       (&this->value,(long)iVar1);
    local_40.field_2._M_local_buf[0] = *pvVar2;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    local_40._M_string_length = 1;
    local_40.field_2._M_local_buf[1] = '\0';
    StringObject(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    this->iter_index = this->iter_index + 1;
  }
  else {
    this_00 = (StringObject *)operator_new(0x10);
    (this_00->super_IteratorObject).super_Object._type = NULLTYPE;
    (this_00->super_IteratorObject).super_Object._vptr_Object = (_func_int **)&PTR_type_00169b80;
  }
  return (Object *)this_00;
}

Assistant:

Object* StringObject::nextItem()
{
    if(this->iter_index >= (int)this->value.size()){
        return new NullObject();
    }
    auto curStr = new StringObject(std::string(1, this->value.at(this->iter_index)));
    this->iter_index++;
    return curStr;
}